

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

format_arg * __thiscall
fmt::v5::
basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
::get_arg(format_arg *__return_storage_ptr__,
         basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
         *this,basic_string_view<wchar_t> name)

{
  format_arg *this_00;
  undefined8 local_30;
  undefined8 uStack_28;
  
  local_30 = *(undefined8 *)
              &(this->
               super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
               ).args_;
  uStack_28 = *(undefined8 *)
               &(this->
                super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                ).field_0x28;
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  ::init(&this->map_,(EVP_PKEY_CTX *)&local_30);
  this_00 = __return_storage_ptr__;
  internal::
  arg_map<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
  ::find(__return_storage_ptr__,&this->map_,name);
  if (__return_storage_ptr__->type_ != none_type) {
    return __return_storage_ptr__;
  }
  internal::error_handler::on_error((error_handler *)this_00,"argument not found");
}

Assistant:

typename basic_format_context<Range, Char>::format_arg
  basic_format_context<Range, Char>::get_arg(
    basic_string_view<char_type> name) {
  map_.init(this->args());
  format_arg arg = map_.find(name);
  if (arg.type() == internal::none_type)
    this->on_error("argument not found");
  return arg;
}